

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setStrictGroupFilter_TestShell::
~TEST_CommandLineArguments_setStrictGroupFilter_TestShell
          (TEST_CommandLineArguments_setStrictGroupFilter_TestShell *this)

{
  TEST_CommandLineArguments_setStrictGroupFilter_TestShell *this_local;
  
  ~TEST_CommandLineArguments_setStrictGroupFilter_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CommandLineArguments, setStrictGroupFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-sg", "group" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.strictMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
}